

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall
ThreadContext::RecyclableData::RecyclableData(RecyclableData *this,Recycler *recycler)

{
  (this->pendingFinallyException).ptr = (JavascriptExceptionObject *)0x0;
  (this->exceptionObject).ptr = (JavascriptExceptionObject *)0x0;
  this->temporaryGuestArenaAllocators[3].ptr = (TempArenaAllocatorWrapper<true> *)0x0;
  this->temporaryGuestArenaAllocators[4].ptr = (TempArenaAllocatorWrapper<true> *)0x0;
  this->temporaryGuestArenaAllocators[1].ptr = (TempArenaAllocatorWrapper<true> *)0x0;
  this->temporaryGuestArenaAllocators[2].ptr = (TempArenaAllocatorWrapper<true> *)0x0;
  this->temporaryArenaAllocators[4].ptr = (TempArenaAllocatorWrapper<false> *)0x0;
  this->temporaryGuestArenaAllocators[0].ptr = (TempArenaAllocatorWrapper<true> *)0x0;
  this->temporaryArenaAllocators[2].ptr = (TempArenaAllocatorWrapper<false> *)0x0;
  this->temporaryArenaAllocators[3].ptr = (TempArenaAllocatorWrapper<false> *)0x0;
  this->temporaryArenaAllocators[0].ptr = (TempArenaAllocatorWrapper<false> *)0x0;
  this->temporaryArenaAllocators[1].ptr = (TempArenaAllocatorWrapper<false> *)0x0;
  Js::JavascriptExceptionObject::JavascriptExceptionObject
            (&this->soErrorObject,(Var)0x0,(ScriptContext *)0x0,(JavascriptExceptionContext *)0x0,
             true);
  Js::JavascriptExceptionObject::JavascriptExceptionObject
            (&this->oomErrorObject,(Var)0x0,(ScriptContext *)0x0,(JavascriptExceptionContext *)0x0,
             true);
  Js::JavascriptExceptionObject::JavascriptExceptionObject
            (&this->terminatedErrorObject,(Var)0x0,(ScriptContext *)0x0,
             (JavascriptExceptionContext *)0x0,false);
  (this->unhandledExceptionObject).ptr = (JavascriptExceptionObject *)0x0;
  (this->tempUncaughtException).ptr = (JavascriptExceptionObject *)0x0;
  JsUtil::
  BaseDictionary<int,_JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->typesWithProtoPropertyCache,recycler,0);
  JsUtil::
  WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
  ::WeaklyReferencedKeyDictionary(&this->propertyGuards,recycler,0x80,(EntryRemovalCallback *)0x0);
  (this->autoProxyName).ptr = (char16_t *)0x0;
  (this->caseInvariantPropertySet).ptr =
       (BaseHashSet<Js::CaseInvariantPropertyListWithHashCode_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::CaseInvariantPropertyListWithHashCode_*,_JsUtil::NoCaseComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->boundPropertyStrings).ptr =
       (List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->sourceProfileManagersByUrl).ptr =
       (BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->codeGenRecyclableDatas).head.ptr = (CodeGenRecyclableData *)0x0;
  (this->codeGenRecyclableDatas).tail.ptr = (CodeGenRecyclableData *)0x0;
  (this->oldEntryPointInfo).ptr = (FunctionEntryPointInfo *)0x0;
  (this->symbolRegistrationMap).ptr =
       (BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->returnedValueList).ptr =
       (List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       0x0;
  this->constructorCacheInvalidationCount = 0;
  return;
}

Assistant:

ThreadContext::RecyclableData::RecyclableData(Recycler *const recycler) :
    pendingFinallyException(nullptr),
    soErrorObject(nullptr, nullptr, nullptr, true),
    oomErrorObject(nullptr, nullptr, nullptr, true),
    terminatedErrorObject(nullptr, nullptr, nullptr),
    typesWithProtoPropertyCache(recycler),
#if ENABLE_NATIVE_CODEGEN
    propertyGuards(recycler, 128),
#endif
    oldEntryPointInfo(nullptr),
#ifdef ENABLE_SCRIPT_DEBUGGING
    returnedValueList(nullptr),
#endif
    constructorCacheInvalidationCount(0)
{
}